

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxConditional::Emit(FxConditional *this,VMFunctionBuilder *build)

{
  BYTE BVar1;
  FxExpression *pFVar2;
  PString *pPVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint extraout_var;
  uint extraout_var_00;
  uint uVar7;
  FScriptPosition *other;
  VM_SHALF opbc;
  ulong uVar8;
  ulong uVar9;
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  uint local_74;
  FString local_68;
  ulong local_60;
  TArray<unsigned_long,_unsigned_long> local_58;
  TArray<unsigned_long,_unsigned_long> local_48;
  size_t local_38;
  
  local_48.Array = (unsigned_long *)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  local_58.Array = (unsigned_long *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  (*this->condition->_vptr_FxExpression[10])(this->condition,build,0);
  VMFunctionBuilder::BackpatchListToHere(build,&local_48);
  iVar5 = (*this->truex->_vptr_FxExpression[3])();
  pFVar2 = this->truex;
  if (((char)iVar5 == '\0') || (pFVar2->ValueType->RegType != '\0')) {
    local_74 = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
    if ((extraout_var & 1) == 0) {
      local_60 = ((ulong)extraout_var & 0xfffffffe) << 0x20;
      uVar9 = (ulong)(local_74 & 0xff000000);
      uVar8 = (ulong)(local_74 & 0xff0000);
      goto LAB_0052ba5d;
    }
    opbc = (VM_SHALF)local_74;
    if ((char)(local_74 >> 0x10) == '\x03') {
      local_74 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
      VMFunctionBuilder::Emit(build,5,local_74 & 0xffff,opbc);
      uVar8 = 0x30000;
    }
    else {
      uVar6 = local_74 >> 0x10 & 0xff;
      if (uVar6 == 2) {
        local_74 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
        VMFunctionBuilder::Emit(build,4,local_74 & 0xffff,opbc);
        uVar8 = 0x20000;
      }
      else {
        if (uVar6 != 1) {
          __assert_fail("trueop.RegType == REGT_STRING",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                        ,0x11e3,"virtual ExpEmit FxConditional::Emit(VMFunctionBuilder *)");
        }
        local_74 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 1,1);
        VMFunctionBuilder::Emit(build,3,local_74 & 0xffff,opbc);
        uVar8 = 0x10000;
      }
    }
  }
  else {
    local_74 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    pPVar3 = (PString *)this->truex[1]._vptr_FxExpression;
    other = &this->truex[1].ScriptPosition;
    if (pPVar3 == TypeString) {
      FString::AttachToOther(&local_68,&other->FileName);
    }
    else {
      local_68.Chars = (other->FileName).Chars;
    }
    BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      iVar5 = (int)(double)local_68.Chars;
    }
    else {
      iVar5 = 0;
      if (BVar1 == '\0') {
        iVar5 = (int)local_68.Chars;
      }
    }
    VMFunctionBuilder::EmitLoadInt(build,local_74 & 0xffff,iVar5);
    if (pPVar3 == TypeString) {
      FString::~FString(&local_68);
    }
    uVar8 = 0;
  }
  uVar9 = 0x1000000;
  local_60 = 0;
LAB_0052ba5d:
  local_38 = VMFunctionBuilder::Emit(build,0x44,0);
  VMFunctionBuilder::BackpatchListToHere(build,&local_58);
  iVar5 = (*this->falsex->_vptr_FxExpression[3])();
  pFVar2 = this->falsex;
  if (((char)iVar5 == '\0') || (pFVar2->ValueType->RegType != '\0')) {
    uVar6 = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
    uVar7 = (uint)(CONCAT44(extraout_var_00,uVar6) >> 0x10);
    bVar4 = (byte)(uVar6 >> 0x10);
    if ((extraout_var_00 & 1) == 0) {
      if ((extraout_var_00 & 0x100) == 0 && bVar4 < 4) {
        VMFunctionBuilder::RegAvailability::Return
                  (build->Registers + (uVar7 & 3),uVar6 & 0xffff,uVar6 >> 0x18);
      }
      VMFunctionBuilder::Emit
                (build,(uint)this->falsex->ValueType->moveOp,local_74 & 0xffff,uVar6 & 0xffff,0);
    }
    else {
      if (2 < (byte)(bVar4 - 1)) {
        __assert_fail("falseop.RegType == REGT_STRING",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x1207,"virtual ExpEmit FxConditional::Emit(VMFunctionBuilder *)");
      }
      VMFunctionBuilder::Emit(build,uVar7 + 2 & 0xff,local_74 & 0xffff,(VM_SHALF)uVar6);
    }
  }
  else {
    pPVar3 = (PString *)pFVar2[1]._vptr_FxExpression;
    if (pPVar3 == TypeString) {
      FString::AttachToOther(&local_68,&pFVar2[1].ScriptPosition.FileName);
    }
    else {
      local_68.Chars = pFVar2[1].ScriptPosition.FileName.Chars;
    }
    BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      iVar5 = (int)(double)local_68.Chars;
    }
    else {
      iVar5 = 0;
      if (BVar1 == '\0') {
        iVar5 = (int)local_68.Chars;
      }
    }
    VMFunctionBuilder::EmitLoadInt(build,local_74 & 0xffff,iVar5);
    if (pPVar3 == TypeString) {
      FString::~FString(&local_68);
    }
  }
  VMFunctionBuilder::BackpatchToHere(build,local_38);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_58);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_48);
  return (ExpEmit)(uVar9 | local_60 | uVar8 | (ushort)local_74);
}

Assistant:

ExpEmit FxConditional::Emit(VMFunctionBuilder *build)
{
	size_t truejump;
	ExpEmit out, falseout;

	// The true and false expressions ought to be assigned to the
	// same temporary instead of being copied to it. Oh well; good enough
	// for now.
	TArray<size_t> yes, no;
	condition->EmitCompare(build, false, yes, no);

	build->BackpatchListToHere(yes);

	if (truex->isConstant() && truex->ValueType->GetRegType() == REGT_INT)
	{
		out = ExpEmit(build, REGT_INT);
		build->EmitLoadInt(out.RegNum, static_cast<FxConstant *>(truex)->GetValue().GetInt());
	}
	else
	{
		ExpEmit trueop = truex->Emit(build);
		if (trueop.Konst)
		{
			trueop.Free(build);
			if (trueop.RegType == REGT_FLOAT)
			{
				out = ExpEmit(build, REGT_FLOAT);
				build->Emit(OP_LKF, out.RegNum, trueop.RegNum);
			}
			else if (trueop.RegType == REGT_POINTER)
			{
				out = ExpEmit(build, REGT_POINTER);
				build->Emit(OP_LKP, out.RegNum, trueop.RegNum);
			}
			else
			{
				assert(trueop.RegType == REGT_STRING);
				out = ExpEmit(build, REGT_STRING);
				build->Emit(OP_LKS, out.RegNum, trueop.RegNum);
			}
		}
		else
		{
			// Use the register returned by the true condition as the
			// target for the false condition.
			out = trueop;
		}
	}
	// Make sure to skip the false path.
	truejump = build->Emit(OP_JMP, 0);

	// Evaluate false expression.
	build->BackpatchListToHere(no);
	if (falsex->isConstant() && falsex->ValueType->GetRegType() == REGT_INT)
	{
		build->EmitLoadInt(out.RegNum, static_cast<FxConstant *>(falsex)->GetValue().GetInt());
	}
	else
	{
		ExpEmit falseop = falsex->Emit(build);
		if (falseop.Konst)
		{
			if (falseop.RegType == REGT_FLOAT)
			{
				build->Emit(OP_LKF, out.RegNum, falseop.RegNum);
			}
			else if (falseop.RegType == REGT_POINTER)
			{
				build->Emit(OP_LKP, out.RegNum, falseop.RegNum);
			}
			else
			{
				assert(falseop.RegType == REGT_STRING);
				build->Emit(OP_LKS, out.RegNum, falseop.RegNum);
			}
			falseop.Free(build);
		}
		else
		{
			// Move result from the register returned by "false" to the one
			// returned by "true" so that only one register is returned by
			// this tree.
			falseop.Free(build);
			build->Emit(falsex->ValueType->GetMoveOp(), out.RegNum, falseop.RegNum, 0);
		}
	}
	build->BackpatchToHere(truejump);

	return out;
}